

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall FIX::IntField::IntField(IntField *this,int field,int data)

{
  string local_38;
  
  IntConvertor::convert_abi_cxx11_(&local_38,(IntConvertor *)(ulong)(uint)data,data);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed588;
  (this->super_FieldBase).m_tag = field;
  (this->super_FieldBase).m_string._M_dataplus._M_p =
       (pointer)&(this->super_FieldBase).m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_FieldBase).m_string,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  (this->super_FieldBase).m_data._M_dataplus._M_p = (pointer)&(this->super_FieldBase).m_data.field_2
  ;
  (this->super_FieldBase).m_data._M_string_length = 0;
  (this->super_FieldBase).m_data.field_2._M_local_buf[0] = '\0';
  (this->super_FieldBase).m_metrics.m_length = 0;
  (this->super_FieldBase).m_metrics.m_checksum = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001edbc8;
  return;
}

Assistant:

explicit IntField( int field, int data )
: FieldBase( field, IntConvertor::convert( data ) ) {}